

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

void parser_response_init(http_parser_t *parser,http_method_t request_method)

{
  http_method_t request_method_local;
  http_parser_t *parser_local;
  
  parser_init(parser);
  (parser->msg).is_request = 0;
  (parser->msg).request_method = request_method;
  (parser->msg).amount_discarded = 0;
  parser->position = POS_RESPONSE_LINE;
  return;
}

Assistant:

void parser_response_init(http_parser_t *parser, http_method_t request_method)
{
	parser_init(parser);
	parser->msg.is_request = 0;
	parser->msg.request_method = request_method;
	parser->msg.amount_discarded = (size_t)0;
	parser->position = POS_RESPONSE_LINE;
}